

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::Next(Parser *this)

{
  size_type *out;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  undefined1 *puVar4;
  uint64_t uVar5;
  bool bVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *__last;
  byte *pbVar9;
  pointer pcVar10;
  byte bVar11;
  int iVar12;
  string *in_RSI;
  string *this_00;
  uint64_t uVar13;
  byte *pbVar14;
  bool bVar15;
  uint uVar16;
  bool bVar17;
  string ch;
  uint64_t val;
  undefined1 local_68 [16];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &in_RSI[2]._M_string_length;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_58);
  pcVar10 = (pointer)in_RSI->_M_string_length;
  puVar4 = (undefined1 *)in_RSI[1]._M_string_length;
  (in_RSI->_M_dataplus)._M_p = pcVar10;
  bVar17 = pcVar10 == (pointer)in_RSI[0x39]._M_string_length;
  in_RSI[1].field_2._M_allocated_capacity = 0;
  out = &in_RSI[1]._M_string_length;
  *puVar4 = 0;
  *(undefined1 *)&in_RSI[1]._M_dataplus._M_p = 1;
LAB_001081b1:
  do {
    iVar12 = *(int *)((long)&in_RSI->field_2 + 8);
    pbVar8 = (byte *)in_RSI->_M_string_length;
switchD_001081f3_caseD_20:
    do {
      pbVar14 = pbVar8;
      pbVar8 = pbVar14 + 1;
      in_RSI->_M_string_length = (size_type)pbVar8;
      bVar11 = *pbVar14;
      uVar16 = (uint)(char)bVar11;
      *(uint *)((long)&in_RSI->field_2 + 0xc) = uVar16;
      switch(bVar11) {
      case 0x20:
        goto switchD_001081f3_caseD_20;
      case 0x21:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x2a:
      case 0x2b:
      case 0x2d:
      case 0x2e:
        goto switchD_001081f3_caseD_21;
      case 0x22:
      case 0x27:
        uVar5 = 0xffffffffffffffff;
        uVar13 = uVar5;
        goto LAB_0010834a;
      case 0x28:
      case 0x29:
      case 0x2c:
        goto switchD_001081f3_caseD_28;
      case 0x2f:
        if (*pbVar8 != 0x2f) {
          if (*pbVar8 == 0x2a) {
            pbVar14 = pbVar14 + 2;
            do {
              in_RSI->_M_string_length = (size_type)pbVar14;
              bVar11 = *pbVar14;
              if (bVar11 == 10) {
                *(byte **)&in_RSI->field_2 = pbVar14;
                iVar12 = iVar12 + 1;
                *(int *)((long)&in_RSI->field_2 + 8) = iVar12;
                bVar11 = *pbVar14;
              }
              else if ((bVar11 == 0x2a) && (bVar11 = 0x2a, pbVar14[1] == 0x2f)) goto LAB_00108273;
              pbVar14 = pbVar14 + 1;
              if (bVar11 == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&ch,"end of file in comment",(allocator<char> *)&val);
                Error(this,in_RSI);
                goto LAB_0010832a;
              }
            } while( true );
          }
          goto switchD_001081f3_caseD_21;
        }
        pbVar8 = pbVar14 + 2;
        while( true ) {
          in_RSI->_M_string_length = (size_type)pbVar8;
          if ((*pbVar8 < 0xe) && ((0x2401U >> (*pbVar8 & 0x1f) & 1) != 0)) break;
          pbVar8 = pbVar8 + 1;
        }
        if (pbVar14[2] == 0x2f) {
          if (bVar17) {
            ch._M_dataplus._M_p = (pointer)&ch.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&ch,pbVar14 + 3);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_58,&ch);
            std::__cxx11::string::~string((string *)&ch);
            bVar17 = true;
            goto LAB_001081b1;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ch,"a documentation comment should be on a line on its own",
                     (allocator<char> *)&val);
          Error(this,in_RSI);
          goto LAB_0010832a;
        }
        goto switchD_001081f3_caseD_20;
      }
    } while ((bVar11 == 9) || (bVar11 == 0xd));
    if ((bVar11 - 0x3a < 5) ||
       ((bVar11 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar11 - 0x5b) & 0x3f) & 1) != 0))))
    goto switchD_001081f3_caseD_28;
    if (bVar11 != 10) break;
    *(byte **)&in_RSI->field_2 = pbVar8;
    piVar1 = (int *)((long)&in_RSI->field_2 + 8);
    *piVar1 = *piVar1 + 1;
    bVar17 = true;
  } while( true );
  if (bVar11 == 0) {
    in_RSI->_M_string_length = (size_type)pbVar14;
    *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x100;
  }
  else {
switchD_001081f3_caseD_21:
    if ((bVar11 == 0x5f) || ((uVar16 & 0xffffffdf) - 0x41 < 0x1a)) {
      while (bVar11 = *pbVar8,
            ((int)(char)bVar11 - 0x30U < 10 || bVar11 == 0x5f) ||
            ((int)(char)bVar11 & 0xffffffdfU) - 0x41 < 0x1a) {
        pbVar8 = pbVar8 + 1;
        in_RSI->_M_string_length = (size_type)pbVar8;
      }
      std::__cxx11::string::append<char_const*,void>((string *)out,(char *)pbVar14,(char *)pbVar8);
      *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x104;
    }
    else {
      if (bVar11 != 0x2b) {
        if (bVar11 == 0x2e) {
          bVar15 = false;
          bVar17 = false;
          if (9 < (int)(char)*pbVar8 - 0x30U) goto switchD_001081f3_caseD_28;
LAB_00108772:
          pbVar9 = pbVar8;
          if (9 < (int)(char)*pbVar8 - 0x30U) {
            bVar17 = false;
            goto LAB_001088d4;
          }
          in_RSI->_M_string_length = (size_type)(pbVar14 + 2);
          bVar11 = pbVar14[1];
          pbVar8 = pbVar14 + 2;
        }
        else {
          if (bVar11 == 0x2d) goto LAB_00108598;
          if (9 < uVar16 - 0x30) goto LAB_0010874d;
          bVar15 = true;
          bVar17 = true;
          pbVar9 = pbVar14;
        }
        if (((bVar17) && (bVar11 == 0x30)) && ((*pbVar8 & 0xdf) == 0x58)) {
          pbVar8 = pbVar8 + 1;
          in_RSI->_M_string_length = (size_type)pbVar8;
          bVar17 = true;
          pbVar9 = pbVar8;
        }
        else {
          bVar17 = false;
        }
LAB_001088d4:
        if (bVar17) {
          while( true ) {
            bVar6 = is_xdigit(*pbVar8);
            pbVar8 = (byte *)in_RSI->_M_string_length;
            if (!bVar6) break;
            pbVar8 = pbVar8 + 1;
            in_RSI->_M_string_length = (size_type)pbVar8;
          }
          bVar11 = *pbVar8;
        }
        else {
          while (bVar11 = *pbVar8, (int)(char)bVar11 - 0x30U < 10) {
            pbVar8 = pbVar8 + 1;
            in_RSI->_M_string_length = (size_type)pbVar8;
          }
        }
        if (bVar11 == 0x2e) goto code_r0x0010890c;
        __last = pbVar8;
        if (pbVar8 <= pbVar9) goto LAB_00108997;
        pbVar7 = pbVar9;
        if (!bVar15) {
          pbVar7 = pbVar8;
        }
        if (bVar17) {
          pbVar9 = pbVar7;
        }
        if ((bool)(((bVar11 & 0xdf) != 0x50 | ~bVar17) & (bVar11 & 0xdf) != 0x45))
        goto LAB_00108997;
        __last = pbVar8 + 1;
        in_RSI->_M_string_length = (size_type)__last;
        if ((pbVar8[1] == 0x2d) || (pbVar9 = __last, pbVar8[1] == 0x2b)) {
          __last = pbVar8 + 2;
          in_RSI->_M_string_length = (size_type)__last;
          pbVar9 = __last;
        }
        while ((int)(char)*__last - 0x30U < 10) {
          __last = __last + 1;
          in_RSI->_M_string_length = (size_type)__last;
        }
        bVar15 = false;
        if (*__last != 0x2e) {
LAB_00108997:
          if (__last <= pbVar9) goto LAB_001089bd;
          std::__cxx11::string::append<char_const*,void>
                    ((string *)out,(char *)pbVar14,(char *)__last);
          *(uint *)((long)&in_RSI->field_2 + 0xc) = !bVar15 + 0x102;
          goto switchD_001081f3_caseD_28;
        }
        in_RSI->_M_string_length = (size_type)(__last + 1);
LAB_001089bd:
        val = (uint64_t)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,pbVar14);
        std::operator+(&ch,"invalid number: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val);
        Error(this,in_RSI);
        std::__cxx11::string::~string((string *)&ch);
        this_00 = (string *)&val;
        goto LAB_0010832f;
      }
LAB_00108598:
      bVar2 = *pbVar8;
      if (((((int)(char)bVar2 == 0x69) && (pbVar14[2] == 0x6e)) && (pbVar14[3] == 0x66)) &&
         (bVar3 = pbVar14[4],
         (9 < (int)(char)bVar3 - 0x30U && bVar3 != 0x5f) &&
         0x19 < ((int)(char)bVar3 & 0xffffffdfU) - 0x41)) {
        std::__cxx11::string::assign<char_const*,void>
                  ((string *)out,(char *)pbVar14,(char *)(pbVar14 + 4));
        *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x103;
        in_RSI->_M_string_length = in_RSI->_M_string_length + 3;
      }
      else if ((bVar2 != 0x5f) && (0x19 < ((int)(char)bVar2 & 0xffffffdfU) - 0x41)) {
LAB_0010874d:
        if ((0x2e < bVar11) || ((0x680000000000U >> ((ulong)bVar11 & 0x3f) & 1) == 0)) {
          ch._M_string_length = 0;
          ch.field_2._M_local_buf[0] = '\0';
          ch._M_dataplus._M_p = (pointer)&ch.field_2;
          std::__cxx11::string::operator=((string *)&ch,bVar11);
          if (0x5e < uVar16 - 0x20) {
            NumToString<char>(&local_50,bVar11);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val
                           ,"code: ",&local_50);
            std::__cxx11::string::operator=((string *)&ch,(string *)&val);
            std::__cxx11::string::~string((string *)&val);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         "illegal character: ",&ch);
          Error(this,in_RSI);
          std::__cxx11::string::~string((string *)&val);
          goto LAB_0010832a;
        }
        bVar17 = true;
        bVar15 = true;
        goto LAB_00108772;
      }
    }
  }
switchD_001081f3_caseD_28:
LAB_00108646:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  goto LAB_0010864c;
LAB_00108273:
  in_RSI->_M_string_length = (size_type)(pbVar14 + 2);
  pbVar8 = pbVar14 + 2;
  goto switchD_001081f3_caseD_20;
LAB_0010834a:
  uVar16 = (uint)uVar13;
  bVar2 = *pbVar8;
  if (bVar2 == bVar11) goto LAB_0010865e;
  if (bVar2 < 0x20) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ch,"illegal character in string constant",(allocator<char> *)&val);
    Error(this,in_RSI);
    goto LAB_0010832a;
  }
  if (bVar2 == 0x5c) {
    *(undefined1 *)&in_RSI[1]._M_dataplus._M_p = 0;
    in_RSI->_M_string_length = (size_type)(pbVar8 + 1);
    bVar2 = pbVar8[1];
    if (uVar16 != 0xffffffff) {
      if (bVar2 == 0x75) {
switchD_001084bb_caseD_75:
        in_RSI->_M_string_length = (size_type)(pbVar8 + 2);
        ParseHexNum(this,(int)in_RSI,(uint64_t *)0x4);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          if ((val & 0xfffffffffffffc00) == 0xdc00) {
            if (uVar16 != 0xffffffff) {
              uVar13 = (uint64_t)(((uint)val & 0x3ff) + (uVar16 & 0x3ff) * 0x400 + 0x10000);
LAB_001084a0:
              ToUTF8((uint32_t)uVar13,(string *)out);
              uVar13 = uVar5;
              goto LAB_00108547;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ch,"illegal Unicode sequence (unpaired low surrogate)",
                       (allocator<char> *)&local_50);
            Error(this,in_RSI);
          }
          else if ((val & 0xfffffffffffffc00) == 0xd800) {
            uVar13 = val;
            if (uVar16 == 0xffffffff) goto LAB_00108547;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ch,"illegal Unicode sequence (multiple high surrogates)",
                       (allocator<char> *)&local_50);
            Error(this,in_RSI);
          }
          else {
            uVar13 = val;
            if (uVar16 == 0xffffffff) goto LAB_001084a0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ch,"illegal Unicode sequence (unpaired high surrogate)",
                       (allocator<char> *)&local_50);
            Error(this,in_RSI);
          }
          std::__cxx11::string::~string((string *)&ch);
        }
        goto LAB_0010864c;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ch,"illegal Unicode sequence (unpaired high surrogate)",
                 (allocator<char> *)&val);
      Error(this,in_RSI);
      goto LAB_0010832a;
    }
    switch(bVar2) {
    case 0x6e:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x76:
    case 0x77:
switchD_001084bb_caseD_6f:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ch,"unknown escape code in string constant",(allocator<char> *)&val);
      Error(this,in_RSI);
      goto LAB_0010832a;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x75:
      goto switchD_001084bb_caseD_75;
    case 0x78:
      in_RSI->_M_string_length = (size_type)(pbVar8 + 2);
      ParseHexNum(this,(int)in_RSI,(uint64_t *)0x2);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        goto LAB_0010841b;
      }
      goto LAB_0010864c;
    default:
      if ((((bVar2 != 0x22) && (bVar2 != 0x27)) && (bVar2 != 0x2f)) &&
         (((bVar2 != 0x5c && (bVar2 != 0x62)) && (bVar2 != 0x66)))) goto switchD_001084bb_caseD_6f;
    }
    std::__cxx11::string::push_back((char)out);
    in_RSI->_M_string_length = in_RSI->_M_string_length + 1;
    uVar13 = uVar5;
  }
  else {
    if (uVar16 != 0xffffffff) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ch,"illegal Unicode sequence (unpaired high surrogate)",
                 (allocator<char> *)&val);
      Error(this,in_RSI);
      goto LAB_0010832a;
    }
    *(byte *)&in_RSI[1]._M_dataplus._M_p =
         *(byte *)&in_RSI[1]._M_dataplus._M_p & (int)(char)bVar2 - 0x20U < 0x5f;
    in_RSI->_M_string_length = (size_type)(pbVar8 + 1);
LAB_0010841b:
    std::__cxx11::string::push_back((char)out);
    uVar13 = uVar5;
  }
LAB_00108547:
  pbVar8 = (byte *)in_RSI->_M_string_length;
  goto LAB_0010834a;
code_r0x0010890c:
  in_RSI->_M_string_length = (size_type)(pbVar8 + 1);
  bVar6 = !bVar15;
  bVar15 = false;
  pbVar8 = pbVar8 + 1;
  if (bVar6) goto LAB_001089bd;
  goto LAB_001088d4;
LAB_0010865e:
  if (uVar16 == 0xffffffff) {
    in_RSI->_M_string_length = (size_type)(pbVar8 + 1);
    if ((*(char *)&in_RSI[1]._M_dataplus._M_p != '\0') ||
       (in_RSI[0x25].field_2._M_local_buf[9] != '\0')) {
LAB_00108710:
      *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x101;
      goto LAB_00108646;
    }
    ch._M_dataplus._M_p = (pointer)in_RSI[1]._M_string_length;
    pcVar10 = ch._M_dataplus._M_p + in_RSI[1].field_2._M_allocated_capacity;
    do {
      if (pcVar10 <= ch._M_dataplus._M_p) goto LAB_00108710;
      iVar12 = FromUTF8((char **)&ch);
    } while (-1 < iVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ch,"illegal UTF-8 sequence",(allocator<char> *)&val);
    Error(this,in_RSI);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ch,"illegal Unicode sequence (unpaired high surrogate)",
               (allocator<char> *)&val);
    Error(this,in_RSI);
  }
LAB_0010832a:
  this_00 = &ch;
LAB_0010832f:
  std::__cxx11::string::~string((string *)this_00);
LAB_0010864c:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::Next() {
  doc_comment_.clear();
  prev_cursor_ = cursor_;
  bool seen_newline = cursor_ == source_;
  attribute_.clear();
  attr_is_trivial_ascii_string_ = true;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0':
        cursor_--;
        token_ = kTokenEof;
        return NoError();
      case ' ':
      case '\r':
      case '\t': break;
      case '\n':
        MarkNewLine();
        seen_newline = true;
        break;
      case '{':
      case '}':
      case '(':
      case ')':
      case '[':
      case ']':
      case '<':
      case '>':
      case ',':
      case ':':
      case ';':
      case '=': return NoError();
      case '\"':
      case '\'': {
        int unicode_high_surrogate = -1;

        while (*cursor_ != c) {
          if (*cursor_ < ' ' && static_cast<signed char>(*cursor_) >= 0)
            return Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            attr_is_trivial_ascii_string_ = false;  // has escape sequence
            cursor_++;
            if (unicode_high_surrogate != -1 && *cursor_ != 'u') {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            switch (*cursor_) {
              case 'n':
                attribute_ += '\n';
                cursor_++;
                break;
              case 't':
                attribute_ += '\t';
                cursor_++;
                break;
              case 'r':
                attribute_ += '\r';
                cursor_++;
                break;
              case 'b':
                attribute_ += '\b';
                cursor_++;
                break;
              case 'f':
                attribute_ += '\f';
                cursor_++;
                break;
              case '\"':
                attribute_ += '\"';
                cursor_++;
                break;
              case '\'':
                attribute_ += '\'';
                cursor_++;
                break;
              case '\\':
                attribute_ += '\\';
                cursor_++;
                break;
              case '/':
                attribute_ += '/';
                cursor_++;
                break;
              case 'x': {  // Not in the JSON standard
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(2, &val));
                attribute_ += static_cast<char>(val);
                break;
              }
              case 'u': {
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(4, &val));
                if (val >= 0xD800 && val <= 0xDBFF) {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (multiple high surrogates)");
                  } else {
                    unicode_high_surrogate = static_cast<int>(val);
                  }
                } else if (val >= 0xDC00 && val <= 0xDFFF) {
                  if (unicode_high_surrogate == -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired low surrogate)");
                  } else {
                    int code_point = 0x10000 +
                                     ((unicode_high_surrogate & 0x03FF) << 10) +
                                     (val & 0x03FF);
                    ToUTF8(code_point, &attribute_);
                    unicode_high_surrogate = -1;
                  }
                } else {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired high surrogate)");
                  }
                  ToUTF8(static_cast<int>(val), &attribute_);
                }
                break;
              }
              default: return Error("unknown escape code in string constant");
            }
          } else {  // printable chars + UTF-8 bytes
            if (unicode_high_surrogate != -1) {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            // reset if non-printable
            attr_is_trivial_ascii_string_ &=
                check_ascii_range(*cursor_, ' ', '~');

            attribute_ += *cursor_++;
          }
        }
        if (unicode_high_surrogate != -1) {
          return Error("illegal Unicode sequence (unpaired high surrogate)");
        }
        cursor_++;
        if (!attr_is_trivial_ascii_string_ && !opts.allow_non_utf8 &&
            !ValidateUTF8(attribute_)) {
          return Error("illegal UTF-8 sequence");
        }
        token_ = kTokenStringConstant;
        return NoError();
      }
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n' && *cursor_ != '\r') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              return Error(
                  "a documentation comment should be on a line on its own");
            doc_comment_.push_back(std::string(start + 1, cursor_));
          }
          break;
        } else if (*cursor_ == '*') {
          cursor_++;
          // TODO: make nested.
          while (*cursor_ != '*' || cursor_[1] != '/') {
            if (*cursor_ == '\n') MarkNewLine();
            if (!*cursor_) return Error("end of file in comment");
            cursor_++;
          }
          cursor_ += 2;
          break;
        }
        FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default:
        if (IsIdentifierStart(c)) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (IsIdentifierStart(*cursor_) || is_digit(*cursor_)) cursor_++;
          attribute_.append(start, cursor_);
          token_ = kTokenIdentifier;
          return NoError();
        }

        const auto has_sign = (c == '+') || (c == '-');
        if (has_sign) {
          // Check for +/-inf which is considered a float constant.
          if (strncmp(cursor_, "inf", 3) == 0 &&
              !(IsIdentifierStart(cursor_[3]) || is_digit(cursor_[3]))) {
            attribute_.assign(cursor_ - 1, cursor_ + 3);
            token_ = kTokenFloatConstant;
            cursor_ += 3;
            return NoError();
          }

          if (IsIdentifierStart(*cursor_)) {
            // '-'/'+' and following identifier - it could be a predefined
            // constant. Return the sign in token_, see ParseSingleValue.
            return NoError();
          }
        }

        auto dot_lvl =
            (c == '.') ? 0 : 1;  // dot_lvl==0 <=> exactly one '.' seen
        if (!dot_lvl && !is_digit(*cursor_)) return NoError();  // enum?
        // Parser accepts hexadecimal-floating-literal (see C++ 5.13.4).
        if (is_digit(c) || has_sign || !dot_lvl) {
          const auto start = cursor_ - 1;
          auto start_digits = !is_digit(c) ? cursor_ : cursor_ - 1;
          if (!is_digit(c) && is_digit(*cursor_)) {
            start_digits = cursor_;  // see digit in cursor_ position
            c = *cursor_++;
          }
          // hex-float can't begind with '.'
          auto use_hex = dot_lvl && (c == '0') && is_alpha_char(*cursor_, 'X');
          if (use_hex) start_digits = ++cursor_;  // '0x' is the prefix, skip it
          // Read an integer number or mantisa of float-point number.
          do {
            if (use_hex) {
              while (is_xdigit(*cursor_)) cursor_++;
            } else {
              while (is_digit(*cursor_)) cursor_++;
            }
          } while ((*cursor_ == '.') && (++cursor_) && (--dot_lvl >= 0));
          // Exponent of float-point number.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            // The exponent suffix of hexadecimal float number is mandatory.
            if (use_hex && !dot_lvl) start_digits = cursor_;
            if ((use_hex && is_alpha_char(*cursor_, 'P')) ||
                is_alpha_char(*cursor_, 'E')) {
              dot_lvl = 0;  // Emulate dot to signal about float-point number.
              cursor_++;
              if (*cursor_ == '+' || *cursor_ == '-') cursor_++;
              start_digits = cursor_;  // the exponent-part has to have digits
              // Exponent is decimal integer number
              while (is_digit(*cursor_)) cursor_++;
              if (*cursor_ == '.') {
                cursor_++;  // If see a dot treat it as part of invalid number.
                dot_lvl = -1;  // Fall thru to Error().
              }
            }
          }
          // Finalize.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            attribute_.append(start, cursor_);
            token_ = dot_lvl ? kTokenIntegerConstant : kTokenFloatConstant;
            return NoError();
          } else {
            return Error("invalid number: " + std::string(start, cursor_));
          }
        }
        std::string ch;
        ch = c;
        if (false == check_ascii_range(c, ' ', '~'))
          ch = "code: " + NumToString(c);
        return Error("illegal character: " + ch);
    }
  }
}